

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

double __thiscall ary::BinaryPattern::match(BinaryPattern *this,Mat *src,int *orientation)

{
  _InputArray *p_Var1;
  size_type sVar2;
  reference pvVar3;
  double dVar4;
  __type _Var5;
  double dVar6;
  double dVar7;
  _InputArray local_2a8;
  _InputArray local_290;
  _InputArray local_278;
  double local_260 [4];
  double local_240;
  double mmm;
  __type local_220;
  double nnn;
  double confidence;
  undefined1 local_208 [4];
  int zero_mean_mode;
  __type local_1f0;
  double normSrcSq;
  _OutputArray local_1e0;
  _OutputArray local_1c8;
  _InputArray local_1b0;
  _OutputArray local_198;
  _OutputArray local_180;
  _InputArray local_158;
  Range local_140;
  Range local_138;
  undefined1 local_130 [8];
  Mat interior;
  Scalar std_int;
  Scalar mean_int;
  Scalar std_ext;
  Scalar mean_ext;
  double den;
  double nom;
  double N;
  double tempsim;
  int i;
  int *orientation_local;
  Mat *src_local;
  BinaryPattern *this_local;
  
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)(std_ext.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)(mean_int.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)(std_int.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)(interior.step.buf + 1));
  cv::Range::Range(&local_138,0x19,0x4b);
  cv::Range::Range(&local_140,0x19,0x4b);
  cv::Mat::operator()((Mat *)local_130,src,local_138,local_140);
  cv::_InputArray::_InputArray(&local_158,src);
  cv::_OutputArray::_OutputArray<double,4,1>
            (&local_180,
             (Matx<double,_4,_1> *)(std_ext.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
  cv::_OutputArray::_OutputArray<double,4,1>
            (&local_198,
             (Matx<double,_4,_1> *)(mean_int.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3))
  ;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_158,&local_180,&local_198,p_Var1);
  cv::_OutputArray::~_OutputArray(&local_198);
  cv::_OutputArray::~_OutputArray(&local_180);
  cv::_InputArray::~_InputArray(&local_158);
  cv::_InputArray::_InputArray(&local_1b0,(Mat *)local_130);
  cv::_OutputArray::_OutputArray<double,4,1>
            (&local_1c8,
             (Matx<double,_4,_1> *)(std_int.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
  cv::_OutputArray::_OutputArray<double,4,1>
            (&local_1e0,(Matx<double,_4,_1> *)(interior.step.buf + 1));
  p_Var1 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_1b0,&local_1c8,&local_1e0,p_Var1);
  cv::_OutputArray::~_OutputArray(&local_1e0);
  cv::_OutputArray::~_OutputArray(&local_1c8);
  cv::_InputArray::~_InputArray(&local_1b0);
  if (std_ext.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] <=
      std_int.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]) {
    cv::_InputArray::_InputArray((_InputArray *)local_208,(Mat *)local_130);
    p_Var1 = (_InputArray *)cv::noArray();
    dVar4 = (double)cv::norm((_InputArray *)local_208,4,p_Var1);
    _Var5 = std::pow<double,int>(dVar4,2);
    cv::_InputArray::~_InputArray((_InputArray *)local_208);
    confidence._4_4_ = 1;
    nnn = -1.0;
    tempsim._4_4_ = 0;
    local_1f0 = _Var5;
    while( true ) {
      sVar2 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(&this->markers);
      if (sVar2 <= (ulong)(long)tempsim._4_4_) break;
      pvVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                         (&this->markers,(long)tempsim._4_4_);
      cv::_InputArray::_InputArray((_InputArray *)&mmm,pvVar3);
      p_Var1 = (_InputArray *)cv::noArray();
      dVar4 = (double)cv::norm((_InputArray *)&mmm,4,p_Var1);
      _Var5 = std::pow<double,int>(dVar4,2);
      cv::_InputArray::~_InputArray((_InputArray *)&mmm);
      local_220 = _Var5;
      if (confidence._4_4_ == 1) {
        pvVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                           (&this->markers,(long)tempsim._4_4_);
        cv::_InputArray::_InputArray(&local_278,pvVar3);
        cv::noArray();
        cv::mean((_InputArray *)local_260,&local_278);
        dVar4 = local_260[0];
        cv::_InputArray::~_InputArray(&local_278);
        local_240 = dVar4;
        pvVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                           (&this->markers,(long)tempsim._4_4_);
        cv::_InputArray::_InputArray(&local_290,pvVar3);
        dVar4 = (double)cv::Mat::dot((_InputArray *)local_130);
        dVar6 = -(std_int.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] * 2500.0) * local_240
        ;
        cv::_InputArray::~_InputArray(&local_290);
        dVar7 = sqrt((-(std_int.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] * 2500.0) *
                      std_int.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] + local_1f0) *
                     (-(local_240 * 2500.0) * local_240 + local_220));
        N = (dVar6 + dVar4) / dVar7;
      }
      else {
        pvVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at
                           (&this->markers,(long)tempsim._4_4_);
        cv::_InputArray::_InputArray(&local_2a8,pvVar3);
        dVar4 = (double)cv::Mat::dot((_InputArray *)local_130);
        dVar6 = sqrt(local_1f0 * local_220);
        N = dVar4 / dVar6;
        cv::_InputArray::~_InputArray(&local_2a8);
      }
      if (nnn < N) {
        nnn = N;
        *orientation = tempsim._4_4_;
      }
      tempsim._4_4_ = tempsim._4_4_ + 1;
    }
    this_local = (BinaryPattern *)nnn;
  }
  else {
    this_local = (BinaryPattern *)0xbff0000000000000;
  }
  normSrcSq._4_4_ = 1;
  cv::Mat::~Mat((Mat *)local_130);
  return (double)this_local;
}

Assistant:

double BinaryPattern::match(const Mat& src, int& orientation) {

	int i;
	double tempsim;
	double N = (double)(PATTERN_SIZE * PATTERN_SIZE / 4);
	double nom, den;

	Scalar mean_ext, std_ext, mean_int, std_int;

	Mat interior = src(cv::Range(PATTERN_SIZE / 4, 3 * PATTERN_SIZE / 4), cv::Range(PATTERN_SIZE / 4, 3 * PATTERN_SIZE / 4));

	meanStdDev(src, mean_ext, std_ext);
	meanStdDev(interior, mean_int, std_int);

	//printf("ext: %f int: %f \n", mean_ext.val[0], mean_int.val[0]);

	if ((mean_ext.val[0] > mean_int.val[0]))
		return -1;

	double normSrcSq = pow(norm(interior), 2);

	//zero_mean_mode;
	int zero_mean_mode = 1;

	//use correlation coefficient as a robust similarity measure
	double confidence = -1.0;
	for (i = 0; i < markers.size(); i++) {

		double const nnn = pow(norm(markers.at(i)), 2);

		if (zero_mean_mode == 1) {

			double const mmm = mean(markers.at(i)).val[0];

			nom = interior.dot(markers.at(i)) - (N * mean_int.val[0] * mmm);
			den = sqrt( (normSrcSq - (N * mean_int.val[0] * mean_int.val[0]) ) * (nnn - (N * mmm * mmm)));
			tempsim = nom / den;
		}
		else
		{
			tempsim = interior.dot(markers.at(i)) / (sqrt(normSrcSq * nnn));
		}

		if (tempsim > confidence) {
			confidence = tempsim;
			orientation = i;
		}
	}

	return confidence;
}